

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_gainer_process_pcm_frames
                    (ma_gainer *pGainer,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  void *pvVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float pRunningGainDelta [32];
  float local_138 [4];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_b8 [4];
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float pRunningGain [32];
  
  if (pGainer == (ma_gainer *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar1 = (pGainer->config).smoothTimeInFrames;
  uVar11 = (ulong)uVar1;
  uVar12 = pGainer->t;
  uVar13 = (ulong)uVar12;
  uVar7 = (ulong)(uVar12 - uVar1);
  if (frameCount <= uVar12 - uVar1) {
    uVar7 = frameCount;
  }
  if (uVar7 == 0 || uVar1 <= uVar12) goto LAB_0013d8f9;
  if (pFramesIn != (void *)0x0 && pFramesOut != (void *)0x0) {
    fVar17 = (float)uVar12 / (float)uVar11;
    fVar18 = 1.0 / (float)uVar11;
    uVar12 = (pGainer->config).channels;
    uVar10 = (ulong)uVar12;
    if (uVar10 < 0x21) {
      if (uVar10 == 0) {
LAB_0013d7aa:
        uVar15 = 0;
      }
      else {
        pfVar2 = pGainer->pNewGains;
        pfVar3 = pGainer->pOldGains;
        fVar20 = pGainer->masterVolume;
        uVar15 = 0;
        do {
          fVar21 = pfVar3[uVar15];
          fVar19 = (pfVar2[uVar15] - fVar21) * fVar20;
          local_b8[uVar15] = fVar18 * fVar19;
          local_138[uVar15] = fVar21 * fVar20 + fVar19 * fVar17;
          uVar15 = uVar15 + 1;
        } while (uVar10 != uVar15);
        if (uVar10 == 8) {
          lVar8 = 0;
          do {
            pfVar2 = (float *)((long)pFramesIn + lVar8);
            fVar17 = pfVar2[1];
            fVar18 = pfVar2[2];
            fVar20 = pfVar2[3];
            pfVar3 = (float *)((long)pFramesOut + lVar8);
            *pfVar3 = *pfVar2 * local_138[0];
            pfVar3[1] = fVar17 * local_138[1];
            pfVar3[2] = fVar18 * local_138[2];
            pfVar3[3] = fVar20 * local_138[3];
            pfVar2 = (float *)((long)pFramesIn + lVar8 + 0x10);
            fVar17 = pfVar2[1];
            fVar18 = pfVar2[2];
            fVar20 = pfVar2[3];
            pfVar3 = (float *)((long)pFramesOut + lVar8 + 0x10);
            *pfVar3 = *pfVar2 * local_128;
            pfVar3[1] = fVar17 * fStack_124;
            pfVar3[2] = fVar18 * fStack_120;
            pfVar3[3] = fVar20 * fStack_11c;
            local_138[0] = local_138[0] + local_b8[0];
            local_138[1] = local_138[1] + local_b8[1];
            local_138[2] = local_138[2] + local_b8[2];
            local_138[3] = local_138[3] + local_b8[3];
            local_128 = local_128 + fStack_a8;
            fStack_124 = fStack_124 + fStack_a4;
            fStack_120 = fStack_120 + fStack_a0;
            fStack_11c = fStack_11c + fStack_9c;
            lVar8 = lVar8 + 0x20;
          } while (uVar7 << 5 != lVar8);
          goto LAB_0013d8e0;
        }
        if (uVar12 == 6) {
          if (1 < uVar7) {
            lVar8 = 0;
            fVar20 = local_138[2];
            fVar21 = local_138[3];
            fVar19 = local_128;
            fVar22 = fStack_124;
            fVar17 = local_138[1];
            fVar18 = local_138[0];
            do {
              fVar18 = local_b8[0] + fVar18;
              fVar17 = local_b8[1] + fVar17;
              fVar20 = fVar20 + local_b8[2];
              fVar21 = fVar21 + local_b8[3];
              fVar19 = fVar19 + fStack_a8;
              fVar22 = fVar22 + fStack_a4;
              pfVar2 = (float *)((long)pFramesIn + lVar8);
              fVar4 = pfVar2[1];
              fVar5 = pfVar2[2];
              fVar6 = pfVar2[3];
              pfVar3 = (float *)((long)pFramesOut + lVar8);
              *pfVar3 = *pfVar2 * local_138[0];
              pfVar3[1] = fVar4 * local_138[1];
              pfVar3[2] = fVar5 * local_138[2];
              pfVar3[3] = fVar6 * local_138[3];
              pfVar2 = (float *)((long)pFramesIn + lVar8 + 0x10);
              fVar4 = pfVar2[1];
              fVar5 = pfVar2[2];
              fVar6 = pfVar2[3];
              pfVar3 = (float *)((long)pFramesOut + lVar8 + 0x10);
              *pfVar3 = *pfVar2 * local_128;
              pfVar3[1] = fVar4 * fStack_124;
              pfVar3[2] = fVar5 * fVar18;
              pfVar3[3] = fVar6 * fVar17;
              pfVar2 = (float *)((long)pFramesIn + lVar8 + 0x20);
              fVar4 = pfVar2[1];
              fVar5 = pfVar2[2];
              fVar6 = pfVar2[3];
              pfVar3 = (float *)((long)pFramesOut + lVar8 + 0x20);
              *pfVar3 = *pfVar2 * fVar20;
              pfVar3[1] = fVar4 * fVar21;
              pfVar3[2] = fVar5 * fVar19;
              pfVar3[3] = fVar6 * fVar22;
              local_138[0] = local_138[0] + local_b8[0];
              local_138[1] = local_138[1] + local_b8[1];
              local_138[2] = local_138[2] + local_b8[2];
              local_138[3] = local_138[3] + local_b8[3];
              local_128 = local_128 + fStack_a8;
              fStack_124 = fStack_124 + fStack_a4;
              lVar8 = lVar8 + 0x30;
            } while ((uVar7 >> 1) * 0x30 != lVar8);
          }
        }
        else {
          if (uVar12 != 2) goto LAB_0013d7aa;
          if (1 < uVar7) {
            lVar8 = 0;
            fVar17 = local_138[0];
            fVar18 = local_138[1];
            do {
              local_138[1] = local_b8[1] + local_138[1];
              local_138[0] = local_b8[0] + local_138[0];
              pfVar2 = (float *)((long)pFramesIn + lVar8);
              fVar20 = pfVar2[1];
              fVar21 = pfVar2[2];
              fVar19 = pfVar2[3];
              pfVar3 = (float *)((long)pFramesOut + lVar8);
              *pfVar3 = *pfVar2 * fVar17;
              pfVar3[1] = fVar20 * fVar18;
              pfVar3[2] = fVar21 * local_138[0];
              pfVar3[3] = fVar19 * local_138[1];
              fVar17 = fVar17 + local_b8[0];
              fVar18 = fVar18 + local_b8[1];
              lVar8 = lVar8 + 0x10;
            } while ((uVar7 >> 1) * 0x10 != lVar8);
          }
        }
        uVar15 = (ulong)((uint)uVar7 & 0xfffffffe);
      }
      if (uVar15 < uVar7) {
        pvVar9 = (void *)((long)pFramesOut + uVar15 * uVar10 * 4);
        pvVar16 = (void *)((long)pFramesIn + uVar15 * uVar10 * 4);
        do {
          if (uVar10 != 0) {
            uVar14 = 0;
            do {
              fVar17 = local_138[uVar14];
              *(float *)((long)pvVar9 + uVar14 * 4) =
                   *(float *)((long)pvVar16 + uVar14 * 4) * fVar17;
              local_138[uVar14] = fVar17 + local_b8[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
          uVar15 = uVar15 + 1;
          pvVar9 = (void *)((long)pvVar9 + uVar10 * 4);
          pvVar16 = (void *)((long)pvVar16 + uVar10 * 4);
        } while (uVar15 != uVar7);
      }
    }
    else {
      pfVar2 = pGainer->pOldGains;
      pfVar3 = pGainer->pNewGains;
      fVar20 = pGainer->masterVolume;
      uVar15 = 0;
      pvVar9 = pFramesIn;
      pvVar16 = pFramesOut;
      do {
        uVar14 = 0;
        do {
          *(float *)((long)pvVar16 + uVar14 * 4) =
               ((pfVar3[uVar14] - pfVar2[uVar14]) * fVar17 + pfVar2[uVar14]) *
               *(float *)((long)pvVar9 + uVar14 * 4) * fVar20;
          uVar14 = uVar14 + 1;
        } while (uVar10 != uVar14);
        fVar17 = fVar17 + fVar18;
        uVar15 = uVar15 + 1;
        pvVar16 = (void *)((long)pvVar16 + uVar10 * 4);
        pvVar9 = (void *)((long)pvVar9 + uVar10 * 4);
      } while (uVar15 != uVar7);
    }
  }
LAB_0013d8e0:
  uVar12 = (uint)(uVar13 + uVar7);
  if (uVar11 <= uVar13 + uVar7) {
    uVar12 = uVar1;
  }
  pGainer->t = uVar12;
  frameCount = frameCount - uVar7;
  pFramesOut = (void *)((long)pFramesOut + uVar7 * 4);
  pFramesIn = (void *)((long)pFramesIn + uVar7 * 4);
LAB_0013d8f9:
  if (pFramesIn != (void *)0x0 && pFramesOut != (void *)0x0) {
    uVar7 = (ulong)(pGainer->config).channels;
    if (uVar7 < 0x21) {
      if (uVar7 != 0) {
        pfVar2 = pGainer->pNewGains;
        fVar17 = pGainer->masterVolume;
        uVar13 = 0;
        do {
          local_138[uVar13] = pfVar2[uVar13] * fVar17;
          uVar13 = uVar13 + 1;
        } while (uVar7 != uVar13);
      }
      if (frameCount != 0) {
        uVar13 = 0;
        do {
          if (uVar7 != 0) {
            uVar10 = 0;
            do {
              *(float *)((long)pFramesOut + uVar10 * 4) =
                   *(float *)((long)pFramesIn + uVar10 * 4) * local_138[uVar10];
              uVar10 = uVar10 + 1;
            } while (uVar7 != uVar10);
          }
          uVar13 = uVar13 + 1;
          pFramesOut = (void *)((long)pFramesOut + uVar7 * 4);
          pFramesIn = (void *)((long)pFramesIn + uVar7 * 4);
        } while (uVar13 != frameCount);
      }
    }
    else if (frameCount != 0) {
      pfVar2 = pGainer->pNewGains;
      fVar17 = pGainer->masterVolume;
      uVar13 = 0;
      do {
        uVar10 = 0;
        do {
          *(float *)((long)pFramesOut + uVar10 * 4) =
               *(float *)((long)pFramesIn + uVar10 * 4) * pfVar2[uVar10] * fVar17;
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
        uVar13 = uVar13 + 1;
        pFramesOut = (void *)((long)pFramesOut + uVar7 * 4);
        pFramesIn = (void *)((long)pFramesIn + uVar7 * 4);
      } while (uVar13 != frameCount);
    }
  }
  if (uVar12 == 0xffffffff) {
    uVar12 = (uint)frameCount;
    if (uVar11 < frameCount) {
      uVar12 = uVar1;
    }
    pGainer->t = uVar12;
    return MA_SUCCESS;
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_gainer_process_pcm_frames(ma_gainer* pGainer, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pGainer == NULL) {
        return MA_INVALID_ARGS;
    }

    /*
    ma_gainer_process_pcm_frames_internal() marks pFramesOut and pFramesIn with MA_RESTRICT which
    helps with auto-vectorization.
    */
    return ma_gainer_process_pcm_frames_internal(pGainer, pFramesOut, pFramesIn, frameCount);
}